

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O2

void ugui_graphics_draw_sprite(ugui_graphics_t *graphics,ugui_sprite_t sprite,ugui_point_t point)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int x;
  uint uVar4;
  undefined1 local_60 [8];
  ugui_sprite_t sprite_local;
  ugui_pixel_t local_31 [8];
  ugui_pixel_t pixel;
  
  sprite_local._0_8_ = sprite.data;
  uVar3 = sprite._0_8_;
  uVar1 = uVar3 >> 0x10;
  local_60 = (undefined1  [8])uVar3;
  sprite_local.data = (uint8_t *)graphics;
  for (uVar2 = 0; uVar2 < ((uint)uVar1 & 0xffff); uVar2 = uVar2 + 1) {
    for (uVar4 = 0; uVar4 < ((uint)uVar3 & 0xffff); uVar4 = uVar4 + 1) {
      _ugui_sprite_get_pixel((ugui_sprite_t *)local_60,(uint16_t)uVar4,(uint16_t)uVar2,local_31);
      if (local_31[0] == true) {
        plot((ugui_graphics_t *)sprite_local.data,((uint)point & 0xffff) + uVar4,
             uVar2 + ((uint)point >> 0x10));
      }
      uVar3 = (ulong)local_60 & 0xffff;
    }
    uVar1 = (ulong)local_60 >> 0x10;
  }
  return;
}

Assistant:

void ugui_graphics_draw_sprite(ugui_graphics_t* graphics, ugui_sprite_t sprite, ugui_point_t point)
{
	for (int y = 0; y < sprite.h; y++) {
		for (int x = 0; x < sprite.w; x++) {
			ugui_pixel_t pixel;
			_ugui_sprite_get_pixel(&sprite, x, y, &pixel);
			if (pixel) {
				plot(graphics, point.x + x, point.y + y);
			}
		}
	}
}